

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O3

void secp256k1_testrand_bytes_test(uchar *bytes,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  memset(bytes,0,len);
  if (len != 0) {
    uVar7 = 0;
    do {
      uVar2 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      uVar8 = secp256k1_test_state[1] ^ secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar5 = secp256k1_test_state[0] ^ uVar2;
      uVar3 = uVar2 << 0x2d | uVar2 >> 0x13;
      uVar2 = uVar3 + uVar5;
      uVar3 = uVar3 ^ uVar8;
      uVar1 = secp256k1_test_state[2] ^ secp256k1_test_state[0] ^ secp256k1_test_state[1] << 0x11 ^
              uVar5;
      uVar4 = uVar8 ^ uVar1;
      uVar6 = uVar5 ^ uVar3;
      uVar3 = uVar3 << 0x2d | uVar3 >> 0x13;
      uVar9 = ((uint)(((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                      secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                      secp256k1_test_state[0] >> 0x3a) *
               (uint)((uVar2 * 0x800000 | uVar2 >> 0x29) + uVar5 >> 0x3b) * 0x1085 + 0x10850 >> 0x11
              ) + 1;
      uVar2 = uVar3 + uVar6;
      uVar1 = uVar1 ^ uVar8 << 0x11 ^ uVar6;
      secp256k1_test_state[1] = uVar1 ^ uVar4;
      secp256k1_test_state[2] = uVar1 ^ uVar4 << 0x11;
      do {
        bytes[uVar7 >> 3] =
             bytes[uVar7 >> 3] |
             (byte)((uVar2 * 0x800000 | uVar2 >> 0x29) + uVar6 >> 0x3f) << ((byte)uVar7 & 7);
        uVar7 = uVar7 + 1;
        if (uVar9 < 2) break;
        uVar9 = uVar9 - 1;
      } while (uVar7 < len << 3);
      uVar4 = uVar4 ^ uVar3;
      secp256k1_test_state[0] = uVar6 ^ uVar4;
      secp256k1_test_state[3] = uVar4 << 0x2d | uVar4 >> 0x13;
    } while (uVar7 < len << 3);
  }
  return;
}

Assistant:

static void secp256k1_testrand_bytes_test(unsigned char *bytes, size_t len) {
    size_t bits = 0;
    memset(bytes, 0, len);
    while (bits < len * 8) {
        int now;
        uint32_t val;
        now = 1 + (secp256k1_testrand_bits(6) * secp256k1_testrand_bits(5) + 16) / 31;
        val = secp256k1_testrand_bits(1);
        while (now > 0 && bits < len * 8) {
            bytes[bits / 8] |= val << (bits % 8);
            now--;
            bits++;
        }
    }
}